

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_task.c
# Opt level: O3

void s_task_context_entry(void)

{
  long lVar1;
  s_event_t *event;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + -0xe8);
  (**(code **)(lVar1 + 0x30))(0,*(undefined8 *)(lVar1 + 0x38));
  *(undefined1 *)(lVar1 + 0x51) = 1;
  event = (s_event_t *)(lVar1 + 0x10);
  s_event_set(event);
  *(undefined1 *)(*(long *)(in_FS_OFFSET + -0xe8) + 0x50) = 0;
  s_timer_run();
  s_task_call_next((s_awaiter_t *)event);
  return;
}

Assistant:

void s_task_context_entry() {
    struct tag_s_task_t *task = g_globals.current_task;
    s_task_fn_t task_entry = task->task_entry;
    void *task_arg         = task->task_arg;

    __async__ = 0;
    (*task_entry)(__await__, task_arg);

    task->closed = true;
    s_event_set(&task->join_event);
    s_task_next(__await__);
}